

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationarrow.cpp
# Opt level: O3

void __thiscall QtMWidgets::NavigationArrow::paintEvent(NavigationArrow *this,QPaintEvent *param_1)

{
  long lVar1;
  Direction DVar2;
  NavigationArrowPrivate *pNVar3;
  QPainter p;
  QRect r;
  undefined1 local_40 [16];
  uint local_30;
  uint uStack_2c;
  double local_28;
  double dStack_20;
  
  QPainter::QPainter((QPainter *)local_40,(QPaintDevice *)&this->field_0x10);
  QPainter::setRenderHint((RenderHint)(QPainter *)local_40,true);
  lVar1 = *(long *)&this->field_0x20;
  local_30 = *(int *)(lVar1 + 0x1c) - *(int *)(lVar1 + 0x14);
  uStack_2c = *(int *)(lVar1 + 0x20) - *(int *)(lVar1 + 0x18);
  local_40._8_8_ = 0.0;
  pNVar3 = (this->d).d;
  DVar2 = pNVar3->direction;
  if (DVar2 == Right) {
    drawArrow((QPainter *)local_40,(QRect *)(local_40 + 8),&pNVar3->color);
    pNVar3 = (this->d).d;
    DVar2 = pNVar3->direction;
  }
  if (DVar2 != Bottom) {
    if (DVar2 != Top) {
      if (DVar2 == Left) {
        QPainter::rotate(180.0);
        local_28 = (double)(int)((local_30 ^ 0xffffffff) + (int)local_40._8_8_);
        dStack_20 = (double)(int)((uStack_2c ^ 0xffffffff) + SUB84(local_40._8_8_,4));
        QPainter::translate((QPointF *)local_40);
        drawArrow((QPainter *)local_40,(QRect *)(local_40 + 8),&((this->d).d)->color);
      }
      goto LAB_00161ffb;
    }
    QPainter::rotate(180.0);
    local_28 = (double)(int)((local_30 ^ 0xffffffff) + (int)local_40._8_8_);
    dStack_20 = (double)(int)((uStack_2c ^ 0xffffffff) + SUB84(local_40._8_8_,4));
    QPainter::translate((QPointF *)local_40);
    pNVar3 = (this->d).d;
  }
  drawArrow2((QPainter *)local_40,(QRect *)(local_40 + 8),&pNVar3->color);
LAB_00161ffb:
  QPainter::~QPainter((QPainter *)local_40);
  return;
}

Assistant:

void
NavigationArrow::paintEvent( QPaintEvent * )
{
	QPainter p( this );
	p.setRenderHint( QPainter::Antialiasing );

	const QRect r = rect();

	if( d->direction == Right )
		drawArrow( &p, r, d->color );
	if( d->direction == Left )
	{
		p.rotate( 180 );
		p.translate( - r.width(), - r.height() );

		drawArrow( &p, r, d->color );
	}
	else if( d->direction == Top )
	{
		p.rotate( 180 );
		p.translate( - r.width(), - r.height() );

		drawArrow2( &p, r, d->color );
	}
	else if( d->direction == Bottom )
		drawArrow2( &p, r, d->color );
}